

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::Arguments::Arguments(Arguments *this)

{
  char *local_18;
  
  (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_18 = (char *)0x0;
  std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
            ((vector<char*,std::allocator<char*>> *)this,(iterator)0x0,&local_18);
  return;
}

Assistant:

Arguments() { args_.push_back(nullptr); }